

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O2

h__Reader * __thiscall
AS_02::PCM::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename,Rational *edit_rate)

{
  bool bVar1;
  undefined4 uVar2;
  char cVar3;
  ui32_t uVar4;
  int iVar5;
  WaveAudioDescriptor *d;
  byte_t *pbVar6;
  ILogSink *pIVar7;
  long lVar8;
  undefined8 uVar9;
  pointer pcVar10;
  Rational *in_RCX;
  char *fmt;
  IndexEntry tmp_entry;
  KLReader reader;
  InterchangeObject *tmp_obj;
  bool local_120;
  byte_t local_11f [8];
  byte_t abStack_117 [95];
  Result_t result;
  undefined **local_50;
  undefined1 local_48;
  byte_t local_47 [8];
  byte_t abStack_3f [15];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reader,(char *)*edit_rate,(allocator<char> *)&tmp_obj);
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)&result,filename);
  std::__cxx11::string::~string((string *)&reader);
  if (_result < 0) {
LAB_00143a7f:
    pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar7,"WaveAudioDescriptor object not found.\n");
    Kumu::Result_t::operator=(&result,(Result_t *)RESULT_AS02_FORMAT);
    bVar1 = true;
    d = (WaveAudioDescriptor *)0x0;
  }
  else {
    tmp_obj = (InterchangeObject *)0x0;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              ((uchar *)&reader,(InterchangeObject **)((long)&filename->field_2 + 8));
    uVar2 = reader._0_4_;
    Kumu::Result_t::~Result_t((Result_t *)&reader);
    if (((int)uVar2 < 0) || (tmp_obj == (InterchangeObject *)0x0)) goto LAB_00143a7f;
    bVar1 = false;
    d = (WaveAudioDescriptor *)
        __dynamic_cast(tmp_obj,&ASDCP::MXF::InterchangeObject::typeinfo,
                       &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
    if (d == (WaveAudioDescriptor *)0x0) goto LAB_00143a7f;
  }
  if (-1 < _result) {
    MXF::AS02IndexReader::Lookup((AS02IndexReader *)&reader,(int)filename + 0x230,(IndexEntry *)0x0)
    ;
    Kumu::Result_t::operator=(&result,(Result_t *)&reader);
    Kumu::Result_t::~Result_t((Result_t *)&reader);
    if (-1 < _result) {
      (**(code **)(**(long **)&filename->field_2 + 0x28))(&reader,*(long **)&filename->field_2,0,0);
      Kumu::Result_t::operator=(&result,(Result_t *)&reader);
      Kumu::Result_t::~Result_t((Result_t *)&reader);
      if (-1 < _result) {
        if (bVar1) {
          __assert_fail("wave_descriptor",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                        ,0x65,
                        "ASDCP::Result_t AS_02::PCM::MXFReader::h__Reader::OpenRead(const std::string &, const ASDCP::Rational &)"
                       );
        }
        reader._8_8_ = 0;
        reader._16_4_ = 0;
        reader._48_8_ = 0;
        reader._56_8_ = 0;
        reader._64_1_ = 0;
        reader._24_8_ = 0;
        reader._32_8_ = 0;
        reader._40_8_ = &PTR__IArchive_00168cc8;
        reader._0_8_ = &PTR__KLVPacket_001694d8;
        ASDCP::KLReader::ReadKLFromFile((IFileReader *)&tmp_obj);
        Kumu::Result_t::operator=(&result,(Result_t *)&tmp_obj);
        Kumu::Result_t::~Result_t((Result_t *)&tmp_obj);
        if (-1 < _result) {
          local_120 = true;
          local_11f[0] = reader.m_KeyBuf[0];
          local_11f[1] = reader.m_KeyBuf[1];
          local_11f[2] = reader.m_KeyBuf[2];
          local_11f[3] = reader.m_KeyBuf[3];
          local_11f[4] = reader.m_KeyBuf[4];
          local_11f[5] = reader.m_KeyBuf[5];
          local_11f[6] = reader.m_KeyBuf[6];
          local_11f[7] = reader.m_KeyBuf[7];
          abStack_117[0] = reader.m_KeyBuf[8];
          abStack_117[1] = reader.m_KeyBuf[9];
          abStack_117[2] = reader.m_KeyBuf[10];
          abStack_117[3] = reader.m_KeyBuf[0xb];
          abStack_117[4] = reader.m_KeyBuf[0xc];
          abStack_117[5] = reader.m_KeyBuf[0xd];
          abStack_117[6] = reader.m_KeyBuf[0xe];
          abStack_117[7] = reader.m_KeyBuf[0xf];
          tmp_obj = (InterchangeObject *)&PTR__IArchive_00168cc8;
          pbVar6 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
          local_48 = 1;
          local_47 = *(byte_t (*) [8])pbVar6;
          abStack_3f._0_8_ = *(undefined8 *)(pbVar6 + 8);
          local_50 = &PTR__IArchive_00168cc8;
          cVar3 = ASDCP::UL::MatchIgnoreStream((UL *)&tmp_obj);
          if (cVar3 == '\0') {
            lVar8 = ASDCP::Dictionary::FindULAnyVersion((uchar *)filename->_M_string_length);
            if (lVar8 == 0) {
              pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
              local_48 = 1;
              local_47[0] = reader.m_KeyBuf[0];
              local_47[1] = reader.m_KeyBuf[1];
              local_47[2] = reader.m_KeyBuf[2];
              local_47[3] = reader.m_KeyBuf[3];
              local_47[4] = reader.m_KeyBuf[4];
              local_47[5] = reader.m_KeyBuf[5];
              local_47[6] = reader.m_KeyBuf[6];
              local_47[7] = reader.m_KeyBuf[7];
              abStack_3f[0] = reader.m_KeyBuf[8];
              abStack_3f[1] = reader.m_KeyBuf[9];
              abStack_3f[2] = reader.m_KeyBuf[10];
              abStack_3f[3] = reader.m_KeyBuf[0xb];
              abStack_3f[4] = reader.m_KeyBuf[0xc];
              abStack_3f[5] = reader.m_KeyBuf[0xd];
              abStack_3f[6] = reader.m_KeyBuf[0xe];
              abStack_3f[7] = reader.m_KeyBuf[0xf];
              local_50 = &PTR__IArchive_00168cc8;
              uVar9 = ASDCP::UL::EncodeString((char *)&local_50,(uint)&tmp_obj);
              Kumu::ILogSink::Error(pIVar7,"Essence wrapper key is not WAVEssenceClip: %s\n",uVar9);
            }
            else {
              pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error
                        (pIVar7,"Essence wrapper key is not WAVEssenceClip: %s\n",
                         *(undefined8 *)(lVar8 + 0x18));
            }
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
            goto LAB_00143d67;
          }
          if ((ulong)*(ushort *)(d + 0x1b8) == 0) {
            pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
            fmt = "EssenceDescriptor has corrupt BlockAlign value, unable to continue.\n";
          }
          else {
            if ((ulong)reader._32_8_ % (ulong)*(ushort *)(d + 0x1b8) == 0) {
              pcVar10 = (pointer)Kumu::IFileReader::TellPosition
                                           ((IFileReader *)(filename->field_2)._M_allocated_capacity
                                           );
              filename[0x28]._M_dataplus._M_p = pcVar10;
              filename[0x28]._M_string_length = reader._32_8_;
              uVar4 = MXF::CalcFrameBufferSize(d,in_RCX);
              *(ui32_t *)((long)&filename[0x28].field_2 + 4) = uVar4;
              iVar5 = (int)(filename[0x28]._M_string_length / (ulong)uVar4);
              *(int *)&filename[0x28].field_2 = iVar5;
              if (filename[0x28]._M_string_length % (ulong)uVar4 != 0) {
                *(int *)&filename[0x28].field_2 = iVar5 + 1;
              }
              goto LAB_00143d57;
            }
            pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
            fmt = "Clip length is not an even multiple of BlockAlign, unable to continue.\n";
          }
          Kumu::ILogSink::Error(pIVar7,fmt);
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
          goto LAB_00143d67;
        }
      }
    }
  }
LAB_00143d57:
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_00143d67:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFReader::h__Reader::OpenRead(const std::string& filename, const ASDCP::Rational& edit_rate)
{
  ASDCP::MXF::WaveAudioDescriptor* wave_descriptor = 0;
  IndexTableSegment::IndexEntry tmp_entry;
  Result_t result = OpenMXFRead(filename.c_str());

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_obj = 0;

      if ( KM_SUCCESS(m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(WaveAudioDescriptor), &tmp_obj)) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);
	}
    }

  if ( wave_descriptor == 0 )
    {
      DefaultLogSink().Error("WaveAudioDescriptor object not found.\n");
      result = RESULT_AS02_FORMAT;
    }

  if ( KM_SUCCESS(result) )
    result = m_IndexAccess.Lookup(0, tmp_entry);

  if ( KM_SUCCESS(result) )
    result = m_File->Seek(tmp_entry.StreamOffset);

  if ( KM_SUCCESS(result) )
    {
      assert(wave_descriptor);
      KLReader reader;
      result = reader.ReadKLFromFile(*m_File);

      if ( KM_SUCCESS(result) )
	{
	  if ( ! UL(reader.Key()).MatchIgnoreStream(m_Dict->ul(MDD_WAVEssenceClip)) )
	    {
	      const MDDEntry *entry = m_Dict->FindULAnyVersion(reader.Key());

	      if ( entry == 0 )
		{
		  char buf[64];
		  DefaultLogSink().Error("Essence wrapper key is not WAVEssenceClip: %s\n", UL(reader.Key()).EncodeString(buf, 64));
		}
	      else
		{
		  DefaultLogSink().Error("Essence wrapper key is not WAVEssenceClip: %s\n", entry->name);
		}
	      
	      return RESULT_AS02_FORMAT;
	    }

	  if ( wave_descriptor->BlockAlign == 0 )
	    {
	      DefaultLogSink().Error("EssenceDescriptor has corrupt BlockAlign value, unable to continue.\n");
	      return RESULT_AS02_FORMAT;
	    }

	  if ( reader.Length() % wave_descriptor->BlockAlign != 0 )
	    {
	      DefaultLogSink().Error("Clip length is not an even multiple of BlockAlign, unable to continue.\n");
	      return RESULT_AS02_FORMAT;
	    }

	  m_ClipEssenceBegin = m_File->TellPosition();
	  m_ClipSize = reader.Length();
	  m_BytesPerFrame = AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, edit_rate);
	  m_ClipDurationFrames = m_ClipSize / m_BytesPerFrame;

	  if ( m_ClipSize % m_BytesPerFrame > 0 )
	    {
	      ++m_ClipDurationFrames; // there is a partial frame at the end
	    }
	}
    }

  return result;
}